

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O3

bool __thiscall
ICM::Compiler::PreliminaryCompile::compileIfSub
          (PreliminaryCompile *this,NodeRange *nr,VecElt *condList,
          vector<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,_std::allocator<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
          *dolists)

{
  pointer *ppEVar1;
  Element *elt;
  iterator iVar2;
  pointer pvVar3;
  uint_t uVar4;
  undefined4 uVar5;
  byte bVar6;
  Element *elt_00;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong uVar7;
  ulong extraout_RAX_01;
  byte bVar8;
  Element *__args;
  initializer_list<ICM::ASTBase::Element> __l;
  VecElt elsedolist;
  allocator_type local_69;
  vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_> local_68;
  vector<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,_std::allocator<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
  *local_50;
  PreliminaryCompile *local_48;
  __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
  local_40;
  __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
  local_38;
  
  elt = (nr->
        super_RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
        )._begin._M_current;
  elt_00 = adjustElement(this,elt);
  checkBoolExp(this,elt_00);
  iVar2._M_current =
       (condList->super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>)
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (condList->super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>::
    _M_realloc_insert<ICM::ASTBase::Element_const&>
              ((vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>> *)condList,iVar2
               ,elt);
  }
  else {
    uVar5 = *(undefined4 *)&elt->field_0x4;
    uVar4 = elt->index;
    (iVar2._M_current)->field_0 = elt->field_0;
    *(undefined4 *)&(iVar2._M_current)->field_0x4 = uVar5;
    (iVar2._M_current)->index = uVar4;
    ppEVar1 = &(condList->
               super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppEVar1 = *ppEVar1 + 1;
  }
  local_40._M_current._0_4_ = 0x1b04;
  local_38._M_current = (Element *)0x0;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_40;
  std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::vector
            (&local_68,__l,&local_69);
  std::
  vector<std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>,std::allocator<std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>>>
  ::emplace_back<std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>>
            ((vector<std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>,std::allocator<std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>>>
              *)dolists,&local_68);
  uVar7 = extraout_RAX;
  local_48 = this;
  if (local_68.super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    uVar7 = extraout_RAX_00;
  }
  bVar6 = (byte)uVar7;
  local_68.super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (nr->
       super_RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
       )._end._M_current;
  __args = (nr->
           super_RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
           )._begin._M_current + 1;
  bVar8 = 1;
  if (__args != local_68.
                super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    pvVar3 = (dolists->
             super__Vector_base<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,_std::allocator<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_50 = dolists;
    do {
      if ((__args->field_0).field_0.etype == '\x04') {
        bVar6 = (__args->field_0).field_0.stype;
        uVar7 = (ulong)bVar6;
        if (bVar6 == 8) {
          local_40._M_current = __args + 1;
          if (local_68.
              super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>.
              _M_impl.super__Vector_impl_data._M_finish <= __args + 1) {
            local_40._M_current =
                 local_68.
                 super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
          }
          local_38._M_current =
               local_68.
               super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          createDoList(&local_68,local_48,(NodeRange *)&local_40);
          std::
          vector<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,_std::allocator<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
          ::push_back(local_50,&local_68);
          if (local_68.
              super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_68.
                            super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_68.
                                  super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_68.
                                  super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          bVar6 = true;
        }
        else {
          if (bVar6 != 9) goto LAB_0013ed46;
          local_68.super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
          ._M_impl.super__Vector_impl_data._M_start = __args + 1;
          if (local_68.
              super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>.
              _M_impl.super__Vector_impl_data._M_finish <= __args + 1) {
            local_68.
            super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 local_68.
                 super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
          }
          bVar6 = compileIfSub(local_48,(NodeRange *)&local_68,condList,local_50);
        }
        bVar8 = 0;
        break;
      }
LAB_0013ed46:
      iVar2._M_current =
           pvVar3[-1].
           super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          pvVar3[-1].
          super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>::
        _M_realloc_insert<ICM::ASTBase::Element_const&>
                  ((vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>> *)
                   (pvVar3 + -1),iVar2,__args);
        uVar7 = extraout_RAX_01;
      }
      else {
        uVar5 = *(undefined4 *)&__args->field_0x4;
        uVar4 = __args->index;
        (iVar2._M_current)->field_0 = __args->field_0;
        *(undefined4 *)&(iVar2._M_current)->field_0x4 = uVar5;
        (iVar2._M_current)->index = uVar4;
        ppEVar1 = &pvVar3[-1].
                   super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppEVar1 = *ppEVar1 + 1;
      }
      bVar6 = (byte)uVar7;
      __args = __args + 1;
    } while (__args != local_68.
                       super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return (bool)(bVar8 | bVar6 & 1);
}

Assistant:

bool compileIfSub(const NodeRange &nr, VecElt &condList, vector<VecElt> &dolists) {
				Element &bexp = *nr.begin();
				checkBoolExp(adjustElement(bexp));
				condList.push_back(bexp);
				dolists.push_back(VecElt{ Element::Keyword(do_) });
				VecElt &dolist = dolists.back();

				auto ib = nr.begin() + 1;
				auto ie = nr.end();
				for (auto iter = ib; iter != ie; ++iter) {
					Element &e = *iter;
					if (e.isKeyword()) {
						if (e.getKeyword() == elsif_) {
							return compileIfSub(rangei(iter + 1, ie), condList, dolists);
						}
						else if (e.getKeyword() == else_) {
							VecElt elsedolist = createDoList(rangei(iter + 1, ie));
							dolists.push_back(elsedolist);
							return true;
						}
					}
					dolist.push_back(e);
				}
				return true;
			}